

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O1

void av1_cnn_convolve_no_maxpool_padding_valid_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  undefined1 (*pauVar31) [32];
  long lVar32;
  ulong uVar33;
  undefined1 *puVar34;
  ulong uVar35;
  float *pfVar36;
  undefined1 (*pauVar37) [32];
  uint uVar38;
  ulong uVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float in_register_0000129c;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM3 [64];
  float in_register_0000131c;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  __m256 shuffle_weight [10];
  long local_370;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined1 local_1a0 [4];
  float fStack_19c;
  undefined8 uStack_198;
  float afStack_190 [2];
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [4];
  float afStack_fc [7];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  float afStack_60 [12];
  
  auVar44 = _DAT_0056d020;
  auVar15 = _DAT_0056d000;
  if (layer_config->filter_width == 2) {
    if (((layer_config->filter_height == 2) && (layer_config->skip_width == 2)) &&
       (layer_config->skip_height == 2)) {
      if (in_height == 0x10 && in_width == 0x10) {
        uVar25 = (ulong)(uint)layer_config->out_channels;
        if (layer_config->out_channels <= start_idx) {
          return;
        }
        lVar26 = (long)cstep;
        lVar24 = (long)in_stride;
        lVar30 = (long)start_idx;
        do {
          fVar40 = layer_config->bias[lVar30];
          lVar32 = 0;
          do {
            *(float *)(local_1a0 + lVar32) = fVar40;
            *(float *)(local_1a0 + lVar32 + 4) = fVar40;
            *(float *)(local_1a0 + lVar32 + 8) = fVar40;
            *(float *)(local_1a0 + lVar32 + 0xc) = fVar40;
            *(float *)(local_1a0 + lVar32 + 0x10) = fVar40;
            *(float *)(local_1a0 + lVar32 + 0x14) = fVar40;
            *(float *)(local_1a0 + lVar32 + 0x18) = fVar40;
            *(float *)(local_1a0 + lVar32 + 0x1c) = fVar40;
            lVar32 = lVar32 + 0x20;
          } while (lVar32 != 0x100);
          iVar28 = layer_config->in_channels;
          if (0 < (long)iVar28) {
            pfVar11 = layer_config->weights;
            lVar32 = 0;
            do {
              lVar29 = lVar32 * (int)uVar25 + lVar30;
              auVar48 = vinsertps_avx(ZEXT416((uint)pfVar11[lVar29]),
                                      ZEXT416((uint)pfVar11[lVar26 + lVar29]),0x10);
              auVar42._4_4_ = 0;
              auVar42._0_4_ = pfVar11[lVar26 * 2 + lVar29];
              auVar42._8_4_ = pfVar11[lVar26 * 2 + lVar29];
              auVar42._12_4_ = 0;
              auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)pfVar11[lVar26 * 3 + lVar29]),0x30);
              auVar15 = vpermpd_avx2(ZEXT1632(auVar42),0x55);
              pfVar36 = input[lVar32] + 8;
              lVar29 = 0;
              do {
                fVar40 = auVar48._0_4_;
                fVar41 = auVar48._4_4_;
                pfVar12 = pfVar36 + lVar24 + -8;
                auVar44._0_4_ = fVar40 * pfVar36[-8] + auVar15._0_4_ * *pfVar12;
                auVar44._4_4_ = fVar41 * pfVar36[-7] + auVar15._4_4_ * pfVar12[1];
                auVar44._8_4_ = fVar40 * pfVar36[-6] + auVar15._8_4_ * pfVar12[2];
                auVar44._12_4_ = fVar41 * pfVar36[-5] + auVar15._12_4_ * pfVar12[3];
                auVar44._16_4_ = fVar40 * pfVar36[-4] + auVar15._16_4_ * pfVar12[4];
                auVar44._20_4_ = fVar41 * pfVar36[-3] + auVar15._20_4_ * pfVar12[5];
                auVar44._24_4_ = fVar40 * pfVar36[-2] + auVar15._24_4_ * pfVar12[6];
                auVar44._28_4_ = in_register_0000129c + in_register_0000131c;
                pfVar12 = pfVar36 + lVar24;
                auVar46._0_4_ = fVar40 * *pfVar36 + auVar15._0_4_ * *pfVar12;
                auVar46._4_4_ = fVar41 * pfVar36[1] + auVar15._4_4_ * pfVar12[1];
                auVar46._8_4_ = fVar40 * pfVar36[2] + auVar15._8_4_ * pfVar12[2];
                auVar46._12_4_ = fVar41 * pfVar36[3] + auVar15._12_4_ * pfVar12[3];
                auVar46._16_4_ = fVar40 * pfVar36[4] + auVar15._16_4_ * pfVar12[4];
                auVar46._20_4_ = fVar41 * pfVar36[5] + auVar15._20_4_ * pfVar12[5];
                auVar46._24_4_ = fVar40 * pfVar36[6] + auVar15._24_4_ * pfVar12[6];
                auVar46._28_4_ = in_ZMM3._28_4_ + in_register_0000131c;
                in_ZMM3 = ZEXT3264(auVar46);
                auVar44 = vhaddps_avx(auVar44,auVar46);
                auVar44 = vpermpd_avx2(auVar44,0xd8);
                in_register_0000129c = auVar44._28_4_ + *(float *)(local_1a0 + lVar29 + 0x1c);
                *(float *)(local_1a0 + lVar29) = auVar44._0_4_ + *(float *)(local_1a0 + lVar29);
                *(float *)(local_1a0 + lVar29 + 4) =
                     auVar44._4_4_ + *(float *)(local_1a0 + lVar29 + 4);
                *(float *)(local_1a0 + lVar29 + 8) =
                     auVar44._8_4_ + *(float *)(local_1a0 + lVar29 + 8);
                *(float *)(local_1a0 + lVar29 + 0xc) =
                     auVar44._12_4_ + *(float *)(local_1a0 + lVar29 + 0xc);
                *(float *)(local_1a0 + lVar29 + 0x10) =
                     auVar44._16_4_ + *(float *)(local_1a0 + lVar29 + 0x10);
                *(float *)(local_1a0 + lVar29 + 0x14) =
                     auVar44._20_4_ + *(float *)(local_1a0 + lVar29 + 0x14);
                *(float *)(local_1a0 + lVar29 + 0x18) =
                     auVar44._24_4_ + *(float *)(local_1a0 + lVar29 + 0x18);
                *(float *)(local_1a0 + lVar29 + 0x1c) = in_register_0000129c;
                pfVar36 = pfVar36 + lVar24 * 2;
                lVar29 = lVar29 + 0x20;
              } while (lVar29 != 0x100);
              lVar32 = lVar32 + 1;
            } while (lVar32 != iVar28);
          }
          lVar32 = 0;
          lVar29 = 0;
          do {
            uVar8 = *(undefined8 *)(local_1a0 + lVar29 + 8);
            uVar20 = *(undefined8 *)(local_1a0 + lVar29 + 0x10);
            uVar21 = *(undefined8 *)(local_1a0 + lVar29 + 0x18);
            puVar6 = (undefined8 *)((long)output[lVar30] + lVar32);
            *puVar6 = *(undefined8 *)(local_1a0 + lVar29);
            puVar6[1] = uVar8;
            puVar6[2] = uVar20;
            puVar6[3] = uVar21;
            lVar29 = lVar29 + 0x20;
            lVar32 = lVar32 + (long)out_stride * 4;
          } while (lVar29 != 0x100);
          lVar30 = lVar30 + channel_step;
          uVar25 = (ulong)layer_config->out_channels;
        } while (lVar30 < (long)uVar25);
        return;
      }
      if (in_height == 8 && in_width == 8) {
        uVar25 = (ulong)(uint)layer_config->out_channels;
        if (layer_config->out_channels <= start_idx) {
          return;
        }
        lVar26 = (long)cstep;
        lVar24 = (long)start_idx;
        do {
          fVar40 = layer_config->bias[lVar24];
          lVar30 = 0;
          do {
            *(float *)(local_1a0 + lVar30) = fVar40;
            *(float *)(local_1a0 + lVar30 + 4) = fVar40;
            *(float *)(local_1a0 + lVar30 + 8) = fVar40;
            *(float *)(local_1a0 + lVar30 + 0xc) = fVar40;
            *(float *)(local_1a0 + lVar30 + 0x10) = fVar40;
            *(float *)(local_1a0 + lVar30 + 0x14) = fVar40;
            *(float *)(local_1a0 + lVar30 + 0x18) = fVar40;
            *(float *)(local_1a0 + lVar30 + 0x1c) = fVar40;
            lVar30 = lVar30 + 0x20;
          } while (lVar30 == 0x20);
          iVar28 = layer_config->in_channels;
          if (0 < (long)iVar28) {
            pfVar11 = layer_config->weights;
            lVar30 = 0;
            do {
              lVar32 = lVar30 * (int)uVar25 + lVar24;
              auVar48 = vinsertps_avx(ZEXT416((uint)pfVar11[lVar32]),
                                      ZEXT416((uint)pfVar11[lVar26 + lVar32]),0x10);
              auVar43._4_4_ = 0;
              auVar43._0_4_ = pfVar11[lVar26 * 2 + lVar32];
              auVar43._8_4_ = pfVar11[lVar26 * 2 + lVar32];
              auVar43._12_4_ = 0;
              auVar42 = vinsertps_avx(auVar43,ZEXT416((uint)pfVar11[lVar26 * 3 + lVar32]),0x30);
              auVar15 = vpermpd_avx2(ZEXT1632(auVar42),0x55);
              pfVar36 = input[lVar30];
              lVar32 = 0;
              do {
                fVar40 = auVar48._0_4_;
                fVar41 = auVar48._4_4_;
                pfVar12 = pfVar36 + in_stride;
                auVar45._0_4_ = fVar40 * *pfVar36 + auVar15._0_4_ * *pfVar12;
                auVar45._4_4_ = fVar41 * pfVar36[1] + auVar15._4_4_ * pfVar12[1];
                auVar45._8_4_ = fVar40 * pfVar36[2] + auVar15._8_4_ * pfVar12[2];
                auVar45._12_4_ = fVar41 * pfVar36[3] + auVar15._12_4_ * pfVar12[3];
                auVar45._16_4_ = fVar40 * pfVar36[4] + auVar15._16_4_ * pfVar12[4];
                auVar45._20_4_ = fVar41 * pfVar36[5] + auVar15._20_4_ * pfVar12[5];
                auVar45._24_4_ = fVar40 * pfVar36[6] + auVar15._24_4_ * pfVar12[6];
                auVar45._28_4_ = in_register_0000129c + in_ZMM3._28_4_;
                pfVar12 = pfVar36 + in_stride * 2;
                pfVar13 = pfVar36 + in_stride * 3;
                auVar47._0_4_ = fVar40 * *pfVar12 + auVar15._0_4_ * *pfVar13;
                auVar47._4_4_ = fVar41 * pfVar12[1] + auVar15._4_4_ * pfVar13[1];
                auVar47._8_4_ = fVar40 * pfVar12[2] + auVar15._8_4_ * pfVar13[2];
                auVar47._12_4_ = fVar41 * pfVar12[3] + auVar15._12_4_ * pfVar13[3];
                auVar47._16_4_ = fVar40 * pfVar12[4] + auVar15._16_4_ * pfVar13[4];
                auVar47._20_4_ = fVar41 * pfVar12[5] + auVar15._20_4_ * pfVar13[5];
                auVar47._24_4_ = fVar40 * pfVar12[6] + auVar15._24_4_ * pfVar13[6];
                auVar47._28_4_ = in_ZMM3._28_4_ + in_register_0000131c;
                in_ZMM3 = ZEXT3264(auVar47);
                auVar44 = vhaddps_avx(auVar45,auVar47);
                auVar44 = vpermpd_avx2(auVar44,0xd8);
                lVar29 = lVar32 * 8;
                fVar40 = *(float *)(local_1a0 + lVar29 + 4);
                fVar41 = *(float *)(local_1a0 + lVar29 + 8);
                fVar16 = *(float *)(local_1a0 + lVar29 + 0xc);
                fVar17 = *(float *)(local_1a0 + lVar29 + 0x10);
                fVar18 = *(float *)(local_180 + lVar29 + -0xc);
                fVar19 = *(float *)(local_180 + lVar29 + -8);
                in_register_0000129c = auVar44._28_4_ + *(float *)(local_180 + lVar29 + -4);
                lVar7 = lVar32 * 8;
                *(float *)(local_1a0 + lVar7) = auVar44._0_4_ + *(float *)(local_1a0 + lVar29);
                *(float *)(local_1a0 + lVar7 + 4) = auVar44._4_4_ + fVar40;
                *(float *)(local_1a0 + lVar7 + 8) = auVar44._8_4_ + fVar41;
                *(float *)(local_1a0 + lVar7 + 0xc) = auVar44._12_4_ + fVar16;
                *(float *)(local_1a0 + lVar7 + 0x10) = auVar44._16_4_ + fVar17;
                *(float *)(local_180 + lVar7 + -0xc) = auVar44._20_4_ + fVar18;
                *(float *)(local_180 + lVar7 + -8) = auVar44._24_4_ + fVar19;
                *(float *)(local_180 + lVar7 + -4) = in_register_0000129c;
                lVar32 = lVar32 + 4;
                pfVar36 = pfVar36 + (long)in_stride * 4;
              } while (lVar32 == 4);
              lVar30 = lVar30 + 1;
            } while (lVar30 != iVar28);
          }
          lVar30 = 0;
          lVar32 = 0;
          do {
            uVar8 = *(undefined8 *)(local_1a0 + lVar32 + 8);
            uVar20 = *(undefined8 *)(local_1a0 + lVar32 + 0x10);
            uVar21 = *(undefined8 *)(local_1a0 + lVar32 + 0x18);
            puVar6 = (undefined8 *)((long)output[lVar24] + lVar30);
            *puVar6 = *(undefined8 *)(local_1a0 + lVar32);
            puVar6[1] = uVar8;
            puVar6[2] = uVar20;
            puVar6[3] = uVar21;
            lVar32 = lVar32 + 0x20;
            lVar30 = lVar30 + (long)(out_stride * 2) * 4;
          } while (lVar32 == 0x20);
          lVar24 = lVar24 + channel_step;
          uVar25 = (ulong)layer_config->out_channels;
        } while (lVar24 < (long)uVar25);
        return;
      }
    }
  }
  else if (((layer_config->filter_width == 5) && (layer_config->filter_height == 5)) &&
          ((layer_config->skip_width == 4 && (layer_config->skip_height == 4)))) {
    uVar9 = layer_config->out_channels;
    if ((int)uVar9 <= start_idx) {
      return;
    }
    pfVar11 = layer_config->bias;
    uVar10 = layer_config->in_channels;
    local_370 = (long)start_idx;
    lVar26 = (long)in_stride * 4;
    do {
      if (0 < (int)uVar10) {
        fVar40 = pfVar11[local_370];
        pfVar36 = layer_config->weights;
        uVar25 = 0;
        do {
          local_220 = ZEXT1632(ZEXT816(0) << 0x40);
          local_280 = ZEXT1632(ZEXT816(0) << 0x40);
          lVar24 = uVar25 * uVar9 + local_370;
          puVar34 = local_280;
          lVar30 = 0;
          local_260 = local_280;
          local_240 = local_280;
          local_200 = local_220;
          do {
            lVar24 = (long)(int)lVar24;
            lVar32 = 0;
            do {
              *(float *)(puVar34 + lVar32 * 4) = pfVar36[lVar24];
              lVar24 = lVar24 + cstep;
              lVar32 = lVar32 + 1;
            } while (lVar32 != 5);
            lVar30 = lVar30 + 1;
            puVar34 = puVar34 + 0x20;
          } while (lVar30 != 5);
          _local_1a0 = vpermps_avx2(_DAT_0056cfc0,local_280);
          local_180 = vpermps_avx2(_DAT_0056cfc0,local_260);
          local_160 = vpermps_avx2(_DAT_0056cfc0,local_240);
          local_140 = vpermps_avx2(_DAT_0056cfc0,local_220);
          local_120 = vpermps_avx2(_DAT_0056cfc0,local_200);
          _local_100 = vpermps_avx2(_DAT_0056cfe0,local_280);
          local_e0 = vpermps_avx2(_DAT_0056cfe0,local_260);
          local_c0 = vpermps_avx2(_DAT_0056cfe0,local_240);
          local_a0 = vpermps_avx2(_DAT_0056cfe0,local_220);
          local_80 = vpermps_avx2(_DAT_0056cfe0,local_200);
          if (4 < in_height) {
            lVar24 = 0;
            lVar30 = 0;
            uVar33 = 0;
            do {
              if (in_width < 0xd) {
                uVar39 = 0;
                uVar35 = 0;
                iVar28 = in_width;
              }
              else {
                lVar32 = uVar33 * (long)out_stride;
                pfVar12 = output[local_370];
                pauVar37 = (undefined1 (*) [32])((long)input[uVar25] + lVar30);
                uVar38 = 0;
                uVar35 = 0;
                iVar27 = in_width;
                do {
                  auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
                  lVar29 = -0xa0;
                  auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
                  pauVar31 = pauVar37;
                  do {
                    auVar46 = vpermilps_avx(*pauVar31,auVar15);
                    auVar45 = vpermps_avx2(auVar44,*(undefined1 (*) [32])(*pauVar31 + 0x1c));
                    auVar54._0_4_ = auVar46._0_4_ * *(float *)(local_100 + lVar29) + auVar55._0_4_;
                    auVar54._4_4_ =
                         auVar46._4_4_ * *(float *)(local_100 + lVar29 + 4) + auVar55._4_4_;
                    auVar54._8_4_ =
                         auVar46._8_4_ * *(float *)(local_100 + lVar29 + 8) + auVar55._8_4_;
                    auVar54._12_4_ =
                         auVar46._12_4_ * *(float *)(local_100 + lVar29 + 0xc) + auVar55._12_4_;
                    auVar54._16_4_ =
                         auVar46._16_4_ * *(float *)(local_100 + lVar29 + 0x10) + auVar55._16_4_;
                    auVar54._20_4_ =
                         auVar46._20_4_ * *(float *)(local_100 + lVar29 + 0x14) + auVar55._20_4_;
                    auVar54._24_4_ =
                         auVar46._24_4_ * *(float *)(local_100 + lVar29 + 0x18) + auVar55._24_4_;
                    auVar54._28_4_ = auVar46._28_4_ + auVar55._28_4_;
                    auVar55 = ZEXT3264(auVar54);
                    auVar49._0_4_ =
                         auVar45._0_4_ * *(float *)((long)afStack_60 + lVar29) + auVar50._0_4_;
                    auVar49._4_4_ =
                         auVar45._4_4_ * *(float *)((long)afStack_60 + lVar29 + 4) + auVar50._4_4_;
                    auVar49._8_4_ =
                         auVar45._8_4_ * *(float *)((long)afStack_60 + lVar29 + 8) + auVar50._8_4_;
                    auVar49._12_4_ =
                         auVar45._12_4_ * *(float *)((long)afStack_60 + lVar29 + 0xc) +
                         auVar50._12_4_;
                    auVar49._16_4_ =
                         auVar45._16_4_ * *(float *)((long)afStack_60 + lVar29 + 0x10) +
                         auVar50._16_4_;
                    auVar49._20_4_ =
                         auVar45._20_4_ * *(float *)((long)afStack_60 + lVar29 + 0x14) +
                         auVar50._20_4_;
                    auVar49._24_4_ =
                         auVar45._24_4_ * *(float *)((long)afStack_60 + lVar29 + 0x18) +
                         auVar50._24_4_;
                    auVar49._28_4_ = auVar45._28_4_ + auVar50._28_4_;
                    auVar50 = ZEXT3264(auVar49);
                    pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar26);
                    lVar29 = lVar29 + 0x20;
                  } while (lVar29 != 0);
                  auVar46 = vhaddps_avx(auVar54,auVar49);
                  auVar43 = auVar46._0_16_;
                  auVar51._0_4_ = auVar46._16_4_ + auVar54._16_4_;
                  auVar51._4_4_ = auVar46._20_4_ + auVar54._20_4_;
                  auVar51._8_4_ = auVar46._24_4_ + auVar54._24_4_;
                  auVar51._12_4_ = auVar46._28_4_ + auVar54._28_4_;
                  auVar56._0_4_ = auVar54._16_4_ + auVar46._0_4_;
                  auVar56._4_4_ = auVar54._16_4_ + auVar46._4_4_;
                  auVar56._8_4_ = auVar54._16_4_ + auVar46._8_4_;
                  auVar56._12_4_ = auVar54._16_4_ + auVar46._12_4_;
                  auVar48 = vblendps_avx(auVar56,auVar51,2);
                  auVar42 = vshufps_avx(auVar43,auVar43,0xe9);
                  auVar52._0_4_ = auVar42._0_4_ + fVar40 + auVar48._0_4_;
                  auVar52._4_4_ = auVar42._4_4_ + fVar40 + auVar48._4_4_;
                  auVar52._8_4_ = auVar42._8_4_ + fVar40 + auVar48._8_4_;
                  auVar52._12_4_ = auVar42._12_4_ + fVar40 + auVar48._12_4_;
                  uVar8 = vmovlps_avx(auVar52);
                  *(undefined8 *)(pfVar12 + lVar32 + uVar35) = uVar8;
                  auVar48._0_4_ = auVar46._16_4_ + auVar49._16_4_;
                  auVar48._4_4_ = auVar46._20_4_ + auVar49._20_4_;
                  auVar48._8_4_ = auVar46._24_4_ + auVar49._24_4_;
                  auVar48._12_4_ = auVar46._28_4_ + auVar49._28_4_;
                  auVar48 = vshufpd_avx(auVar48,auVar48,1);
                  auVar42 = vshufps_avx(auVar43,auVar43,0xff);
                  pfVar12[lVar32 + uVar35 + 2] = auVar42._0_4_ + fVar40 + auVar48._0_4_;
                  uVar35 = uVar35 + 3;
                  uVar38 = uVar38 + 0xc;
                  iVar28 = iVar27 + -0xc;
                  pauVar37 = (undefined1 (*) [32])(pauVar37[1] + 0x10);
                  bVar14 = 0x18 < iVar27;
                  iVar27 = iVar28;
                } while (bVar14);
                uVar35 = uVar35 & 0xffffffff;
                uVar39 = (ulong)uVar38;
              }
              local_1c0 = local_220._0_4_;
              fStack_1bc = local_220._4_4_;
              fStack_1b8 = local_220._8_4_;
              fStack_1b4 = local_220._12_4_;
              local_1e0 = local_200._0_4_;
              fStack_1dc = local_200._4_4_;
              fStack_1d8 = local_200._8_4_;
              fStack_1d4 = local_200._12_4_;
              if (4 < iVar28) {
                lVar32 = lVar30 + uVar39 * 4;
                pfVar12 = input[uVar25];
                pfVar13 = output[local_370];
                iVar28 = iVar28 + 4;
                lVar29 = 0;
                do {
                  lVar7 = lVar29 * 4 + lVar32;
                  lVar22 = lVar26 + lVar7;
                  lVar23 = lVar26 + lVar22;
                  pfVar1 = (float *)((long)pfVar12 + lVar26 + lVar7);
                  pfVar2 = (float *)((long)pfVar12 + lVar26 + lVar22);
                  pfVar3 = (float *)((long)pfVar12 + lVar26 + lVar23);
                  pfVar4 = (float *)((long)pfVar12 + lVar26 + lVar26 + lVar23);
                  local_2e0 = local_280._0_4_;
                  fStack_2dc = local_280._4_4_;
                  fStack_2d8 = local_280._8_4_;
                  fStack_2d4 = local_280._12_4_;
                  pfVar5 = (float *)((long)pfVar12 + lVar29 * 4 + lVar32);
                  auVar53._0_4_ =
                       local_2e0 * *pfVar5 + 0.0 +
                       local_1c0 * *pfVar3 + local_1e0 * *pfVar4 +
                       local_240._0_4_ * *pfVar2 + local_260._0_4_ * *pfVar1;
                  auVar53._4_4_ =
                       fStack_2dc * pfVar5[1] + 0.0 +
                       fStack_1bc * pfVar3[1] + fStack_1dc * pfVar4[1] +
                       local_240._4_4_ * pfVar2[1] + local_260._4_4_ * pfVar1[1];
                  auVar53._8_4_ =
                       fStack_2d8 * pfVar5[2] + 0.0 +
                       fStack_1b8 * pfVar3[2] + fStack_1d8 * pfVar4[2] +
                       local_240._8_4_ * pfVar2[2] + local_260._8_4_ * pfVar1[2];
                  auVar53._12_4_ =
                       fStack_2d4 * pfVar5[3] + 0.0 +
                       fStack_1b4 * pfVar3[3] + fStack_1d4 * pfVar4[3] +
                       local_240._12_4_ * pfVar2[3] + local_260._12_4_ * pfVar1[3];
                  auVar48 = vhaddps_avx(auVar53,auVar53);
                  auVar42 = vmovshdup_avx(auVar48);
                  *(float *)((long)pfVar13 + lVar29 + lVar24 + uVar35 * 4) =
                       auVar42._0_4_ +
                       fVar40 + (float)local_200._16_4_ *
                                *(float *)((long)pfVar12 + lVar26 + 0x10 + lVar26 + lVar23) +
                                (float)local_220._16_4_ *
                                *(float *)((long)pfVar12 + lVar26 + 0x10 + lVar23) +
                                (float)local_240._16_4_ *
                                *(float *)((long)pfVar12 + lVar26 + 0x10 + lVar22) +
                                (float)local_260._16_4_ *
                                *(float *)((long)pfVar12 + lVar26 + 0x10 + lVar7) +
                                (float)local_280._16_4_ *
                                *(float *)((long)pfVar12 + lVar29 * 4 + lVar32 + 0x10) + 0.0 +
                       auVar48._0_4_;
                  lVar29 = lVar29 + 4;
                  iVar28 = iVar28 + -4;
                } while (8 < iVar28);
              }
              uVar33 = uVar33 + 1;
              lVar30 = lVar30 + (long)in_stride * 0x10;
              lVar24 = lVar24 + (long)out_stride * 4;
            } while (uVar33 != (in_height - 5U >> 2) + 1);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar10);
      }
      local_370 = local_370 + channel_step;
    } while (local_370 < (int)uVar9);
    return;
  }
  av1_cnn_convolve_no_maxpool_padding_valid_c
            (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,cstep,
             channel_step);
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  if (layer_config->filter_width == 5 && layer_config->filter_height == 5 &&
      layer_config->skip_width == 4 && layer_config->skip_height == 4) {
    cnn_convolve_no_maxpool_padding_valid_5x5_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else if (layer_config->filter_width == 2 &&
             layer_config->filter_height == 2 &&
             layer_config->skip_width == 2 && layer_config->skip_height == 2) {
    cnn_convolve_no_maxpool_padding_valid_2x2_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else {
    av1_cnn_convolve_no_maxpool_padding_valid_c(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  }
}